

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  int *piVar1;
  undefined8 *puVar2;
  uint *puVar3;
  bool bVar4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  Tolerances *pTVar8;
  pointer pnVar9;
  DataKey *pDVar10;
  int *piVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined1 uVar14;
  Result RVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  DuplicateColsPS *pDVar21;
  FixBoundsPS *pFVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  pointer pDVar24;
  SPxOut *pSVar25;
  ulong uVar26;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  int iVar29;
  uint n;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  uint n_00;
  cpp_dec_float<50U,_int,_void> *pcVar34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar36;
  long lVar37;
  cpp_dec_float<50U,_int,_void> *pcVar38;
  double dVar39;
  long in_FS_OFFSET;
  Real a;
  undefined1 auVar40 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  fpclass_type local_948;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  int *perm;
  uint auStack_8b0 [2];
  uint local_8a8 [2];
  uint auStack_8a0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_898;
  int local_890;
  bool local_88c;
  long local_888;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_878;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_868;
  undefined8 uStack_860;
  double local_858;
  undefined8 uStack_850;
  double local_848;
  undefined8 uStack_840;
  int *idxMem;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_828;
  undefined8 uStack_820;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_818;
  undefined8 uStack_810;
  ulong local_800;
  long local_7f8;
  undefined8 uStack_7f0;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  int *local_7c8;
  undefined8 local_7c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_778;
  int local_738;
  int local_734;
  bool *local_730;
  undefined8 local_728;
  shared_ptr<soplex::Tolerances> local_720;
  shared_ptr<soplex::Tolerances> local_710;
  shared_ptr<soplex::Tolerances> local_700;
  shared_ptr<soplex::Tolerances> local_6f0;
  shared_ptr<soplex::Tolerances> local_6e0;
  shared_ptr<soplex::Tolerances> local_6d0;
  shared_ptr<soplex::Tolerances> local_6c0;
  int local_6b0;
  int local_6ac;
  int *local_6a8;
  undefined8 local_6a0;
  double local_698;
  undefined8 uStack_690;
  long local_688;
  undefined8 uStack_680;
  long local_678;
  bool *local_670;
  DataArray<int> local_668;
  DataArray<int> local_650;
  DataArray<int> local_638;
  int local_620;
  int local_61c;
  bool *local_618;
  undefined8 local_610;
  int *local_608;
  uint auStack_600 [4];
  undefined5 uStack_5f0;
  undefined3 uStack_5eb;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  int local_5e0;
  undefined1 local_5dc;
  long local_5d8;
  DataArray<int> local_5d0;
  int *local_5b8;
  uint auStack_5b0 [4];
  undefined5 uStack_5a0;
  undefined3 uStack_59b;
  undefined5 local_598;
  undefined3 uStack_593;
  int local_590;
  undefined1 local_58c;
  long local_588;
  int *local_578;
  uint auStack_570 [4];
  undefined5 uStack_560;
  undefined3 uStack_55b;
  undefined5 local_558;
  undefined3 uStack_553;
  int local_550;
  undefined1 local_54c;
  long local_548;
  int *local_538;
  uint auStack_530 [4];
  undefined5 uStack_520;
  undefined3 uStack_51b;
  undefined5 local_518;
  undefined3 uStack_513;
  int local_510;
  undefined1 local_50c;
  long local_508;
  int *local_4f8;
  uint auStack_4f0 [4];
  undefined5 uStack_4e0;
  undefined3 uStack_4db;
  undefined5 local_4d8;
  undefined3 uStack_4d3;
  int local_4d0;
  undefined1 local_4cc;
  long local_4c8;
  cpp_dec_float<50u,int,void> local_4b8 [8];
  uint auStack_4b0 [2];
  uint local_4a8 [2];
  undefined5 uStack_4a0;
  undefined3 uStack_49b;
  uint local_498 [3];
  undefined1 local_48c;
  undefined8 local_488;
  int *local_478;
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  element_type *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  element_type *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  element_type *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  element_type *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  element_type *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  uint local_358 [2];
  uint auStack_350 [2];
  uint local_348 [2];
  uint auStack_340 [2];
  uint local_338 [4];
  uint local_328 [2];
  uint auStack_320 [2];
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [4];
  int *local_2f8;
  uint auStack_2f0 [2];
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  element_type *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  double local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  undefined1 local_68 [29];
  undefined3 uStack_4b;
  undefined1 auStack_48 [13];
  undefined8 local_38;
  
  local_670 = again;
  RVar15 = removeEmpty(this,lp);
  if (RVar15 == OKAY) {
    iVar29 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    RVar15 = OKAY;
    if (1 < iVar29) {
      local_7c8 = (int *)0x0;
      local_7c0 = 0x3ff3333333333333;
      spx_alloc<int*>(&local_7c8,iVar29);
      iVar29 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      local_6a8 = (int *)0x0;
      local_6a0 = 0x3ff3333333333333;
      local_6b0 = 0;
      if (0 < iVar29) {
        local_6b0 = iVar29;
      }
      local_6ac = 1;
      if (0 < iVar29) {
        local_6ac = local_6b0;
      }
      spx_alloc<int*>(&local_6a8,local_6ac);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      piVar11 = idxMem;
      *local_7c8 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar18 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *local_6a8 = iVar18;
      iVar29 = 0;
      if (1 < iVar18) {
        lVar30 = 1;
        iVar29 = 0;
        lVar37 = 0x38;
        do {
          local_7c8[lVar30] = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar37),0.0);
          local_6a8[lVar30] = 0;
          piVar11[lVar30 + -1] = (int)lVar30;
          lVar30 = lVar30 + 1;
          iVar29 = iVar29 + 1;
          lVar37 = lVar37 + 0x38;
        } while (lVar30 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_5d8 = 0xa00000000;
      local_608 = (int *)0x0;
      auStack_600[0] = 0;
      auStack_600[1] = 0;
      auStack_600[2] = 0;
      auStack_600[3] = 0;
      uStack_5f0 = 0;
      uStack_5eb = 0;
      local_5e8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)0x0;
      local_5e0 = 0;
      local_5dc = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_608,0.0);
      local_870 = lp;
      if (0 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        dVar39 = 0.0;
        do {
          pIVar5 = (local_870->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar18 = (local_870->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[(long)dVar39].idx;
          local_858 = dVar39;
          if (0 < pIVar5[iVar18].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            pIVar5 = pIVar5 + iVar18;
            lVar30 = 0;
            lVar37 = 0;
            do {
              pnVar9 = scale.data.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pNVar6 = (pIVar5->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              uVar7 = *(undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar30 + 0x20);
              result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              result_2.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])((long)(pNVar6->val).m_backend.data._M_elems + lVar30);
              puVar3 = (uint *)((long)(pNVar6->val).m_backend.data._M_elems + lVar30 + 0x10);
              result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
              uVar7 = *(undefined8 *)(puVar3 + 2);
              result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
              result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              result_2.m_backend.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar30);
              result_2.m_backend.neg =
                   *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar30 + 4);
              result_2.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar30 + 8);
              iVar18 = *(int *)((long)(&((pIVar5->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar30);
              local_7f8 = lVar37;
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 10;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems._24_5_ = 0;
                result.m_backend.data._M_elems[7]._1_3_ = 0;
                result.m_backend.data._M_elems._32_5_ = 0;
                result.m_backend.data._M_elems[9]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&result.m_backend,0.0);
                iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&pnVar9[iVar18].m_backend,&result.m_backend);
                if (iVar16 == 0) {
                  *(ulong *)(scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.data.
                             _M_elems + 8) =
                       CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                                result_2.m_backend.data._M_elems._32_5_);
                  puVar3 = scale.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.data._M_elems
                           + 4;
                  *(undefined8 *)puVar3 = result_2.m_backend.data._M_elems._16_8_;
                  *(ulong *)(puVar3 + 2) =
                       CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                                result_2.m_backend.data._M_elems._24_5_);
                  *(undefined8 *)
                   scale.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.data._M_elems =
                       result_2.m_backend.data._M_elems._0_8_;
                  *(undefined8 *)
                   (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.data._M_elems + 2) =
                       result_2.m_backend.data._M_elems._8_8_;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.exp =
                       result_2.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.neg =
                       result_2.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.fpclass =
                       result_2.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend.prec_elem =
                       result_2.m_backend.prec_elem;
                }
              }
              iVar16 = local_7c8[iVar18];
              pDVar24 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&result_2.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar24 + iVar16,iVar18,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result.m_backend);
              piVar1 = local_6a8 + local_7c8[iVar18];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar37 = (long)iVar29;
                iVar29 = iVar29 + 1;
                piVar11[lVar37] = local_7c8[iVar18];
              }
              lVar37 = local_7f8 + 1;
              iVar18 = (pIVar5->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
              uVar26 = (ulong)iVar18;
              lVar30 = lVar30 + 0x3c;
            } while (lVar37 < (long)uVar26);
            if (0 < iVar18) {
              pDVar24 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar39 = 0.0;
              do {
                iVar18 = local_7c8[(pIVar5->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem[(long)dVar39].idx];
                if (0 < pDVar24[iVar18].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pTVar8 = (this->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  p_Var35 = (this->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  if (p_Var35 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var35->_M_use_count = p_Var35->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var35->_M_use_count = p_Var35->_M_use_count + 1;
                    }
                  }
                  a = Tolerances::epsilon(pTVar8);
                  local_488._0_4_ = cpp_dec_float_finite;
                  local_488._4_4_ = 10;
                  _local_4b8 = (undefined1  [16])0x0;
                  local_4a8[0] = 0;
                  local_4a8[1] = 0;
                  uStack_4a0 = 0;
                  uStack_49b = 0;
                  local_498[0] = 0;
                  local_498[1] = 0;
                  local_498[2] = 0;
                  local_48c = 0;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (local_4b8,a);
                  auVar12 = _local_4b8;
                  local_778.data._M_elems[8] = local_498[0];
                  local_778.data._M_elems[9] = local_498[1];
                  local_778.data._M_elems[7]._1_3_ = uStack_49b;
                  local_778.data._M_elems._24_5_ = uStack_4a0;
                  local_778.data._M_elems[4] = local_4a8[0];
                  local_778.data._M_elems[5] = local_4a8[1];
                  local_778.data._M_elems._0_8_ = local_4b8;
                  local_778.data._M_elems[2] = auStack_4b0[0];
                  local_778.data._M_elems[3] = auStack_4b0[1];
                  local_778.exp = local_498[2];
                  local_778.neg = (bool)local_48c;
                  local_778.fpclass = (fpclass_type)local_488;
                  local_778.prec_elem = local_488._4_4_;
                  _local_4b8 = auVar12;
                  if (p_Var35 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var35);
                  }
                  pDVar24 = (this->m_classSetCols).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  iVar16 = pDVar24[iVar18].
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
                  if (1 < iVar16) {
                    SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                              (pDVar24[iVar18].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem,iVar16,(ElementCompare *)&local_778,0,true);
                    pDVar24 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  iVar16 = *piVar11;
                  lVar30 = (long)iVar29;
                  iVar29 = iVar29 + -1;
                  *piVar11 = piVar11[lVar30 + -1];
                  local_848 = dVar39;
                  if (0 < pDVar24[iVar18].
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused) {
                    pSVar27 = &pDVar24[iVar18].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ;
                    lVar37 = 0;
                    lVar30 = 0;
                    do {
                      uVar14 = local_5dc;
                      iVar17 = local_5e0;
                      if (lVar37 != 0) {
                        pNVar6 = pSVar27->m_elem;
                        pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    **)((long)(pNVar6->val).m_backend.data._M_elems + lVar37 + 0x20)
                        ;
                        puVar2 = (undefined8 *)
                                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar37);
                        local_2c8 = (element_type *)*puVar2;
                        p_Stack_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
                        puVar2 = (undefined8 *)
                                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar37 + 0x10);
                        local_2b8 = *puVar2;
                        uStack_2b0 = puVar2[1];
                        local_7f8 = *(long *)((long)(&(pNVar6->val).m_backend.data + 1) +
                                             lVar37 + 8U);
                        uStack_7f0 = 0;
                        local_2d8 = local_5e8;
                        auStack_2e0[1]._1_3_ = uStack_5eb;
                        auStack_2e0._0_5_ = uStack_5f0;
                        local_2e8[0] = auStack_600[2];
                        local_2e8[1] = auStack_600[3];
                        local_2f8 = local_608;
                        auStack_2f0[0] = auStack_600[0];
                        auStack_2f0[1] = auStack_600[1];
                        local_688 = local_5d8;
                        uStack_680 = 0;
                        local_2a8 = pnVar28;
                        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_a0,this);
                        ptr_1.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = local_2c8;
                        ptr_1.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi = p_Stack_2c0;
                        perm = local_2f8;
                        auStack_8b0[0] = auStack_2f0[0];
                        auStack_8b0[1] = auStack_2f0[1];
                        local_8a8[0] = local_2e8[0];
                        local_8a8[1] = local_2e8[1];
                        auStack_8a0[0] = auStack_2e0[0];
                        auStack_8a0[1] = auStack_2e0[1];
                        local_898 = local_2d8;
                        local_890 = iVar17;
                        local_88c = (bool)uVar14;
                        local_888 = local_688;
                        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                  (&result_2,(soplex *)&ptr_1,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&perm,pnVar28);
                        result.m_backend.data._M_elems._32_5_ =
                             result_2.m_backend.data._M_elems._32_5_;
                        result.m_backend.data._M_elems[9]._1_3_ =
                             result_2.m_backend.data._M_elems[9]._1_3_;
                        result.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                        result.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                        result.m_backend.data._M_elems._24_5_ =
                             result_2.m_backend.data._M_elems._24_5_;
                        result.m_backend.data._M_elems[7]._1_3_ =
                             result_2.m_backend.data._M_elems[7]._1_3_;
                        result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                        result.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                        result.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                        result.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                        auVar12 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                        result.m_backend.exp = result_2.m_backend.exp;
                        result.m_backend.neg = result_2.m_backend.neg;
                        result.m_backend.fpclass = result_2.m_backend.fpclass;
                        result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                        if ((result_2.m_backend.neg == true) &&
                           (result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0],
                           result.m_backend.data._M_elems[0] != 0 ||
                           result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                          result.m_backend.neg = false;
                        }
                        result.m_backend.data._M_elems._0_16_ = auVar12;
                        if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                            (local_a0.fpclass != cpp_dec_float_NaN)) &&
                           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&result.m_backend,&local_a0), 0 < iVar17)) {
                          iVar16 = *piVar11;
                          lVar20 = (long)iVar29;
                          iVar29 = iVar29 + -1;
                          *piVar11 = piVar11[lVar20 + -1];
                        }
                      }
                      pDVar24 = (this->m_classSetCols).data.
                                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pSVar27 = &pDVar24[iVar18].
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ;
                      pNVar6 = pSVar27->m_elem;
                      local_7c8[*(int *)((long)(&pNVar6->val + 1) + lVar37)] = iVar16;
                      local_6a8[iVar16] = local_6a8[iVar16] + 1;
                      local_5e8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    **)((long)(pNVar6->val).m_backend.data._M_elems + lVar37 + 0x20)
                      ;
                      puVar2 = (undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar37);
                      local_608 = (int *)*puVar2;
                      auStack_600._0_8_ = puVar2[1];
                      puVar3 = (uint *)((long)(pNVar6->val).m_backend.data._M_elems + lVar37 + 0x10)
                      ;
                      auStack_600._8_8_ = *(undefined8 *)puVar3;
                      uVar7 = *(undefined8 *)(puVar3 + 2);
                      uStack_5f0 = (undefined5)uVar7;
                      uStack_5eb = (undefined3)((ulong)uVar7 >> 0x28);
                      local_5e0 = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar37);
                      local_5dc = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar37 + 4U)
                      ;
                      local_5d8 = *(long *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar37 + 8U)
                      ;
                      lVar30 = lVar30 + 1;
                      lVar37 = lVar37 + 0x3c;
                    } while (lVar30 < pDVar24[iVar18].
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .memused);
                  }
                  pDVar24[iVar18].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused = 0;
                  uVar26 = (ulong)(uint)(pIVar5->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .memused;
                  dVar39 = local_848;
                }
                dVar39 = (double)((long)dVar39 + 1);
              } while ((long)dVar39 < (long)(int)uVar26);
            }
          }
          dVar39 = (double)((long)local_858 + 1);
        } while ((long)dVar39 <
                 (long)(local_870->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
      }
      pSVar36 = local_870;
      free(idxMem);
      idxMem = (int *)0x0;
      local_734 = (pSVar36->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
      local_730 = (bool *)0x0;
      local_728 = 0x3ff3333333333333;
      local_738 = local_734;
      if (local_734 < 1) {
        local_734 = 1;
        local_738 = 0;
      }
      spx_alloc<bool*>(&local_730,local_734);
      local_61c = (pSVar36->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
      local_618 = (bool *)0x0;
      local_610 = 0x3ff3333333333333;
      local_620 = local_61c;
      if (local_61c < 1) {
        local_61c = 1;
        local_620 = 0;
      }
      spx_alloc<bool*>(&local_618,local_61c);
      auVar12 = _DAT_005f4040;
      iVar29 = (pSVar36->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar29) {
        pDVar24 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar30 = (long)iVar29 + -1;
        auVar40._8_4_ = (int)lVar30;
        auVar40._0_8_ = lVar30;
        auVar40._12_4_ = (int)((ulong)lVar30 >> 0x20);
        lVar30 = 0;
        auVar40 = auVar40 ^ _DAT_005f4040;
        auVar41 = _DAT_005f4020;
        auVar42 = _DAT_005f4030;
        do {
          auVar43 = auVar42 ^ auVar12;
          iVar18 = auVar40._4_4_;
          if ((bool)(~(auVar43._4_4_ == iVar18 && auVar40._0_4_ < auVar43._0_4_ ||
                      iVar18 < auVar43._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar24->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar30) = 0;
          }
          if ((auVar43._12_4_ != auVar40._12_4_ || auVar43._8_4_ <= auVar40._8_4_) &&
              auVar43._12_4_ <= auVar40._12_4_) {
            *(undefined4 *)
             ((long)&pDVar24[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar30) = 0;
          }
          auVar43 = auVar41 ^ auVar12;
          iVar16 = auVar43._4_4_;
          if (iVar16 <= iVar18 && (iVar16 != iVar18 || auVar43._0_4_ <= auVar40._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar24[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar30) = 0;
            *(undefined4 *)
             ((long)&pDVar24[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar30) = 0;
          }
          lVar37 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 4;
          auVar42._8_8_ = lVar37 + 4;
          lVar37 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 4;
          auVar41._8_8_ = lVar37 + 4;
          lVar30 = lVar30 + 0x80;
        } while ((ulong)(iVar29 + 3U >> 2) << 7 != lVar30);
        if (0 < iVar29) {
          lVar30 = 0;
          do {
            local_730[lVar30] = false;
            local_618[lVar30] = false;
            iVar29 = local_7c8[lVar30];
            pDVar24 = (this->m_dupCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&result,0.0);
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(pDVar24 + iVar29,(int)lVar30,&result);
            lVar30 = lVar30 + 1;
            pSVar36 = local_870;
          } while (lVar30 < (local_870->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
      }
      local_5d0.data = (int *)0x0;
      local_5d0.memFactor = 1.2;
      local_5d0.thesize = 0;
      local_5d0.themax = 1;
      spx_alloc<int*>(&local_5d0.data,1);
      n = (pSVar36->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
      if ((int)n < 1) {
        local_800 = 0;
      }
      else {
        local_878 = &this->m_hist;
        local_858 = *(double *)(in_FS_OFFSET + -8);
        uStack_850 = 0;
        local_848 = -local_858;
        uStack_840 = 0x8000000000000000;
        pDVar24 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar30 = 0;
        uVar26 = 0;
        do {
          lVar37 = lVar30 * 0x20;
          if ((1 < pDVar24[lVar30].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             ((pSVar36->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(pSVar36->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [(pDVar24[lVar30].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1)) {
            local_7f8 = lVar37;
            if ((uVar26 & 1) == 0) {
              pDVar21 = (DuplicateColsPS *)operator_new(0x168);
              local_148.m_backend.fpclass = cpp_dec_float_finite;
              local_148.m_backend.prec_elem = 10;
              local_148.m_backend.data._M_elems[0] = 0;
              local_148.m_backend.data._M_elems[1] = 0;
              local_148.m_backend.data._M_elems[2] = 0;
              local_148.m_backend.data._M_elems[3] = 0;
              local_148.m_backend.data._M_elems[4] = 0;
              local_148.m_backend.data._M_elems[5] = 0;
              local_148.m_backend.data._M_elems._24_5_ = 0;
              local_148.m_backend.data._M_elems[7]._1_3_ = 0;
              local_148.m_backend.data._M_elems._32_5_ = 0;
              local_148.m_backend._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_148,1.0);
              DataArray<int>::DataArray(&local_638,&local_5d0);
              local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS
                        (pDVar21,pSVar36,0,0,&local_148,&local_638,&local_6c0,true,false);
              result.m_backend.data._M_elems._0_8_ = pDVar21;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         (result.m_backend.data._M_elems + 2),pDVar21);
              if (local_6c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_6c0.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              lVar37 = local_7f8;
              if (local_638.data != (int *)0x0) {
                free(local_638.data);
                local_638.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_878->data,(value_type *)&result);
              if (result.m_backend.data._M_elems._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           result.m_backend.data._M_elems._8_8_);
              }
              pDVar24 = (this->m_dupCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar26 = CONCAT71((int7)((ulong)pDVar21 >> 8),1);
            }
            if (0 < *(int *)((long)&(pDVar24->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused + lVar37)) {
              lVar20 = 0;
              local_800 = uVar26;
              local_678 = lVar30;
              do {
                if (0 < *(int *)((long)&(pDVar24->
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).memused + lVar37)) {
                  lVar37 = (long)&pDVar24->_vptr_DSVectorBase + lVar37;
                  lVar33 = 0x38;
                  lVar30 = 0;
                  local_688 = lVar20;
                  do {
                    if (local_688 != lVar30) {
                      iVar29 = *(int *)(*(long *)(lVar37 + 8) + 0x38 + local_688 * 0x3c);
                      lVar20 = (long)iVar29;
                      if (local_730[lVar20] == false) {
                        iVar18 = *(int *)(*(long *)(lVar37 + 8) + lVar33);
                        lVar37 = (long)iVar18;
                        if (local_730[lVar37] == false) {
                          pnVar9 = (pSVar36->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).object.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_308._0_8_ =
                               *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                          local_328 = pnVar9[lVar20].m_backend.data._M_elems[0];
                          auStack_320 = *(uint (*) [2])(pnVar9[lVar20].m_backend.data._M_elems + 2);
                          puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                          local_318 = *(uint (*) [2])puVar3;
                          auStack_310 = *(uint (*) [2])(puVar3 + 2);
                          iVar16 = pnVar9[lVar20].m_backend.exp;
                          bVar4 = pnVar9[lVar20].m_backend.neg;
                          uVar7._0_4_ = pnVar9[lVar20].m_backend.fpclass;
                          uVar7._4_4_ = pnVar9[lVar20].m_backend.prec_elem;
                          local_778.data._M_elems._32_8_ =
                               *(undefined8 *)(pnVar9[lVar37].m_backend.data._M_elems + 8);
                          local_778.data._M_elems._0_8_ =
                               *(undefined8 *)&pnVar9[lVar37].m_backend.data;
                          local_778.data._M_elems._8_8_ =
                               *(undefined8 *)(pnVar9[lVar37].m_backend.data._M_elems + 2);
                          puVar3 = pnVar9[lVar37].m_backend.data._M_elems + 4;
                          local_778.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                          local_778.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
                          local_778.exp = pnVar9[lVar37].m_backend.exp;
                          local_778.neg = pnVar9[lVar37].m_backend.neg;
                          local_778.fpclass = pnVar9[lVar37].m_backend.fpclass;
                          local_778.prec_elem = pnVar9[lVar37].m_backend.prec_elem;
                          factor.m_backend.fpclass = cpp_dec_float_finite;
                          factor.m_backend.prec_elem = 10;
                          factor.m_backend.data._M_elems[0] = 0;
                          factor.m_backend.data._M_elems[1] = 0;
                          factor.m_backend.data._M_elems[2] = 0;
                          factor.m_backend.data._M_elems[3] = 0;
                          factor.m_backend.data._M_elems[4] = 0;
                          factor.m_backend.data._M_elems[5] = 0;
                          factor.m_backend.data._M_elems._24_5_ = 0;
                          factor.m_backend.data._M_elems[7]._1_3_ = 0;
                          factor.m_backend.data._M_elems._32_5_ = 0;
                          factor.m_backend.data._M_elems[9]._1_3_ = 0;
                          factor.m_backend.exp = 0;
                          factor.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&factor.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar37].m_backend);
                          result_2.m_backend.fpclass = cpp_dec_float_finite;
                          result_2.m_backend.prec_elem = 10;
                          result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result_2.m_backend.data._M_elems[4] = 0;
                          result_2.m_backend.data._M_elems[5] = 0;
                          result_2.m_backend.data._M_elems._24_5_ = 0;
                          result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                          result_2.m_backend.data._M_elems._32_5_ = 0;
                          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                          result_2.m_backend.exp = 0;
                          result_2.m_backend.neg = false;
                          pcVar34 = &local_778;
                          if (&result_2.m_backend !=
                              &scale.data.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend) {
                            result_2.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_
                            ;
                            result_2.m_backend.data._M_elems[9]._1_3_ =
                                 local_778.data._M_elems[9]._1_3_;
                            result_2.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
                            result_2.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
                            result_2.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_
                            ;
                            result_2.m_backend.data._M_elems[7]._1_3_ =
                                 local_778.data._M_elems[7]._1_3_;
                            result_2.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
                            result_2.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
                            result_2.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
                            result_2.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
                            result_2.m_backend.exp = local_778.exp;
                            result_2.m_backend.neg = local_778.neg;
                            result_2.m_backend.fpclass = local_778.fpclass;
                            result_2.m_backend.prec_elem = local_778.prec_elem;
                            pcVar34 = &scale.data.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&result_2.m_backend,pcVar34);
                          result.m_backend.fpclass = cpp_dec_float_finite;
                          result.m_backend.prec_elem = 10;
                          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems[4] = 0;
                          result.m_backend.data._M_elems[5] = 0;
                          result.m_backend.data._M_elems._24_5_ = 0;
                          result.m_backend.data._M_elems[7]._1_3_ = 0;
                          result.m_backend.data._M_elems._32_5_ = 0;
                          result.m_backend.data._M_elems[9]._1_3_ = 0;
                          result.m_backend.exp = 0;
                          result.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&result.m_backend,&result_2.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar37].m_backend);
                          result_3.m_backend.data._M_elems[8] = local_308[0];
                          result_3.m_backend.data._M_elems[9] = local_308[1];
                          result_3.m_backend.data._M_elems[4] = local_318[0];
                          result_3.m_backend.data._M_elems[5] = local_318[1];
                          result_3.m_backend.data._M_elems[6] = auStack_310[0];
                          result_3.m_backend.data._M_elems[7] = auStack_310[1];
                          result_3.m_backend.data._M_elems[0] = local_328[0];
                          result_3.m_backend.data._M_elems[1] = local_328[1];
                          result_3.m_backend.data._M_elems[2] = auStack_320[0];
                          result_3.m_backend.data._M_elems[3] = auStack_320[1];
                          result_3.m_backend.exp = iVar16;
                          result_3.m_backend.neg = bVar4;
                          result_3.m_backend._48_8_ = uVar7;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                    (&result_3.m_backend,&result.m_backend);
                          uVar7 = result_3.m_backend._48_8_;
                          bVar4 = result_3.m_backend.neg;
                          iVar16 = result_3.m_backend.exp;
                          local_358[0] = result_3.m_backend.data._M_elems[0];
                          local_358[1] = result_3.m_backend.data._M_elems[1];
                          auStack_350[0] = result_3.m_backend.data._M_elems[2];
                          auStack_350[1] = result_3.m_backend.data._M_elems[3];
                          local_348[0] = result_3.m_backend.data._M_elems[4];
                          local_348[1] = result_3.m_backend.data._M_elems[5];
                          auStack_340[0] = result_3.m_backend.data._M_elems[6];
                          auStack_340[1] = result_3.m_backend.data._M_elems[7];
                          local_338[0] = result_3.m_backend.data._M_elems[8];
                          local_338[1] = result_3.m_backend.data._M_elems[9];
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_d8,this);
                          uVar13 = result_3.m_backend._48_8_;
                          result.m_backend.data._M_elems._32_5_ = SUB85(local_338._0_8_,0);
                          result.m_backend.data._M_elems[9]._1_3_ = SUB83(local_338._0_8_,5);
                          result.m_backend.data._M_elems[4] = local_348[0];
                          result.m_backend.data._M_elems[5] = local_348[1];
                          result.m_backend.data._M_elems._24_5_ = auStack_340._0_5_;
                          result.m_backend.data._M_elems[7]._1_3_ = auStack_340[1]._1_3_;
                          result.m_backend.data._M_elems[2] = auStack_350[0];
                          result.m_backend.data._M_elems[3] = auStack_350[1];
                          result.m_backend.data._M_elems[0] = local_358[0];
                          result.m_backend.data._M_elems[1] = local_358[1];
                          auVar12 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                          result.m_backend.exp = iVar16;
                          result.m_backend.neg = bVar4;
                          local_948 = (fpclass_type)uVar7;
                          result_3.m_backend.fpclass = (fpclass_type)uVar7;
                          result_3.m_backend.prec_elem = SUB84(uVar7,4);
                          result.m_backend.fpclass = result_3.m_backend.fpclass;
                          result.m_backend.prec_elem = result_3.m_backend.prec_elem;
                          if ((bVar4 != false) &&
                             (result.m_backend.data._M_elems[0] = local_358[0],
                             result.m_backend.data._M_elems[0] != 0 ||
                             local_948 != cpp_dec_float_finite)) {
                            result.m_backend.neg = (bool)(bVar4 ^ 1);
                          }
                          result.m_backend.data._M_elems._0_16_ = auVar12;
                          result_3.m_backend._48_8_ = uVar13;
                          if ((local_948 == cpp_dec_float_NaN) ||
                             (local_d8.fpclass == cpp_dec_float_NaN)) {
LAB_002e9908:
                            pSVar36 = local_870;
                            pcVar34 = &(local_870->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).low.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar37].m_backend;
                            ::soplex::infinity::__tls_init();
                            result.m_backend.fpclass = cpp_dec_float_finite;
                            result.m_backend.prec_elem = 10;
                            result.m_backend.data._M_elems[0] = 0;
                            result.m_backend.data._M_elems[1] = 0;
                            result.m_backend.data._M_elems[2] = 0;
                            result.m_backend.data._M_elems[3] = 0;
                            result.m_backend.data._M_elems[4] = 0;
                            result.m_backend.data._M_elems[5] = 0;
                            result.m_backend.data._M_elems._24_5_ = 0;
                            result.m_backend.data._M_elems[7]._1_3_ = 0;
                            result.m_backend.data._M_elems._32_5_ = 0;
                            result.m_backend.data._M_elems[9]._1_3_ = 0;
                            result.m_backend.exp = 0;
                            result.m_backend.neg = false;
                            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                      ((cpp_dec_float<50u,int,void> *)&result.m_backend,local_848);
                            if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                               (iVar18 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (pcVar34,&result.m_backend), 0 < iVar18)) {
                              pcVar34 = &(pSVar36->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar37].m_backend
                              ;
                              ::soplex::infinity::__tls_init();
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_858);
                              if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                  (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                 ((iVar18 = boost::multiprecision::backends::
                                            cpp_dec_float<50U,_int,_void>::compare
                                                      (pcVar34,&result.m_backend), iVar18 < 0 ||
                                  (factor.m_backend.fpclass == cpp_dec_float_NaN))))
                              goto LAB_002eb5dc;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar18 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((iVar18 < 0) && (result_3.m_backend.fpclass != cpp_dec_float_NaN))
                              {
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar18 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result_3.m_backend,&result.m_backend);
                                if (iVar18 < 1) goto LAB_002e9d20;
                                pcVar34 = &(pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_858
                                         );
                                if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                    (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                   (iVar18 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), -1 < iVar18))
                                goto LAB_002ebbe3;
                                pnVar9 = (pSVar36->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                pFVar22 = (FixBoundsPS *)operator_new(0x30);
                                local_248.m_backend.data._M_elems._32_8_ =
                                     *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                                local_248.m_backend.data._M_elems._0_8_ =
                                     *(undefined8 *)&pnVar9[lVar20].m_backend.data;
                                local_248.m_backend.data._M_elems._8_8_ =
                                     *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 2);
                                puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                                local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                                local_248.m_backend.data._M_elems._24_8_ =
                                     *(undefined8 *)(puVar3 + 2);
                                local_248.m_backend.exp = pnVar9[lVar20].m_backend.exp;
                                local_248.m_backend.neg = pnVar9[lVar20].m_backend.neg;
                                local_248.m_backend.fpclass = pnVar9[lVar20].m_backend.fpclass;
                                local_248.m_backend.prec_elem = pnVar9[lVar20].m_backend.prec_elem;
                                local_700.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_700.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                                if (local_700.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_700.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_700.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_700.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_700.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                FixBoundsPS::FixBoundsPS
                                          (pFVar22,pSVar36,iVar29,&local_248,&local_700);
                                result.m_backend.data._M_elems._0_8_ = pFVar22;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                           (result.m_backend.data._M_elems + 2),pFVar22);
                                if (local_700.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_700.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                std::
                                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ::push_back(&local_878->data,(value_type *)&result.m_backend);
                                (*(pSVar36->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2a])
                                          (pSVar36,lVar20,
                                           (pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
joined_r0x002eb07c:
                                p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          result.m_backend.data._M_elems._8_8_;
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    result.m_backend.data._M_elems._8_8_ !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_002eb5d7:
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (p_Var35);
                                }
                              }
                              else {
LAB_002e9d20:
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar18 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if ((0 < iVar18) &&
                                     (result_3.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                    cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                    iVar18 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (&result_3.m_backend,&result.m_backend);
                                    if (iVar18 < 0) {
                                      pcVar34 = &(pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 10;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[4] = 0;
                                      result.m_backend.data._M_elems[5] = 0;
                                      result.m_backend.data._M_elems._24_5_ = 0;
                                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result.m_backend.data._M_elems._32_5_ = 0;
                                      result.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                                local_848);
                                      if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                          (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar18 = boost::multiprecision::backends::
                                                   cpp_dec_float<50U,_int,_void>::compare
                                                             (pcVar34,&result.m_backend), iVar18 < 1
                                         )) goto LAB_002ebbe3;
                                      pnVar9 = (pSVar36->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      pFVar22 = (FixBoundsPS *)operator_new(0x30);
                                      local_288.m_backend.data._M_elems._32_8_ =
                                           *(undefined8 *)
                                            (pnVar9[lVar20].m_backend.data._M_elems + 8);
                                      local_288.m_backend.data._M_elems._0_8_ =
                                           *(undefined8 *)&pnVar9[lVar20].m_backend.data;
                                      local_288.m_backend.data._M_elems._8_8_ =
                                           *(undefined8 *)
                                            (pnVar9[lVar20].m_backend.data._M_elems + 2);
                                      puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                                      local_288.m_backend.data._M_elems._16_8_ =
                                           *(undefined8 *)puVar3;
                                      local_288.m_backend.data._M_elems._24_8_ =
                                           *(undefined8 *)(puVar3 + 2);
                                      local_288.m_backend.exp = pnVar9[lVar20].m_backend.exp;
                                      local_288.m_backend.neg = pnVar9[lVar20].m_backend.neg;
                                      local_288.m_backend.fpclass = pnVar9[lVar20].m_backend.fpclass
                                      ;
                                      local_288.m_backend.prec_elem =
                                           pnVar9[lVar20].m_backend.prec_elem;
                                      local_710.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (this->
                                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                )._tolerances.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr;
                                      local_710.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                                      if (local_710.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_710.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_710.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_710.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_710.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      FixBoundsPS::FixBoundsPS
                                                (pFVar22,pSVar36,iVar29,&local_288,&local_710);
                                      result.m_backend.data._M_elems._0_8_ = pFVar22;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                 (result.m_backend.data._M_elems + 2),pFVar22);
                                      if (local_710.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_710.
                                                                                                      
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      std::
                                      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ::push_back(&local_878->data,(value_type *)&result.m_backend);
                                      (*(pSVar36->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2d])
                                                (pSVar36,lVar20,
                                                 (pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar20,
                                                 0);
                                      goto joined_r0x002eb07c;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) goto LAB_002eb5dc;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar18 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((0 < iVar18) && (result_3.m_backend.fpclass != cpp_dec_float_NaN))
                              {
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar18 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result_3.m_backend,&result.m_backend);
                                if (iVar18 < 1) goto LAB_002e9ea9;
                                pcVar34 = &(pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_858
                                         );
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar18 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), iVar18 < 0)) {
                                  pnVar9 = (pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  pFVar22 = (FixBoundsPS *)operator_new(0x30);
                                  local_1c8.m_backend.data._M_elems._32_8_ =
                                       *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                                  local_1c8.m_backend.data._M_elems._0_8_ =
                                       *(undefined8 *)&pnVar9[lVar20].m_backend.data;
                                  local_1c8.m_backend.data._M_elems._8_8_ =
                                       *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 2);
                                  puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                                  local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                                  local_1c8.m_backend.data._M_elems._24_8_ =
                                       *(undefined8 *)(puVar3 + 2);
                                  local_1c8.m_backend.exp = pnVar9[lVar20].m_backend.exp;
                                  local_1c8.m_backend.neg = pnVar9[lVar20].m_backend.neg;
                                  local_1c8.m_backend.fpclass = pnVar9[lVar20].m_backend.fpclass;
                                  local_1c8.m_backend.prec_elem = pnVar9[lVar20].m_backend.prec_elem
                                  ;
                                  local_6e0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr;
                                  local_6e0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi =
                                       (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                                  if (local_6e0.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      (local_6e0.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_6e0.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      (local_6e0.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_6e0.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                    }
                                  }
                                  FixBoundsPS::FixBoundsPS
                                            (pFVar22,pSVar36,iVar29,&local_1c8,&local_6e0);
                                  result.m_backend.data._M_elems._0_8_ = pFVar22;
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             (result.m_backend.data._M_elems + 2),pFVar22);
                                  if (local_6e0.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_6e0.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  std::
                                  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                  ::push_back(&local_878->data,(value_type *)&result.m_backend);
                                  (*(pSVar36->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])
                                            (pSVar36,lVar20,
                                             (pSVar36->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                                  p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            result.m_backend.data._M_elems._8_8_;
                                  if (result.m_backend.data._M_elems._8_8_ == 0) goto LAB_002eb5dc;
                                  goto LAB_002eb5d7;
                                }
LAB_002ebbe3:
                                RVar15 = UNBOUNDED;
                                goto LAB_002ebe5b;
                              }
LAB_002e9ea9:
                              if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar18 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if ((iVar18 < 0) &&
                                   (result_3.m_backend.fpclass != cpp_dec_float_NaN)) {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar18 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&result_3.m_backend,&result.m_backend);
                                  if (iVar18 < 0) {
                                    pcVar34 = &(pSVar36->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                              local_848);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar18 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), 0 < iVar18))
                                    {
                                      pnVar9 = (pSVar36->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      pFVar22 = (FixBoundsPS *)operator_new(0x30);
                                      local_208.m_backend.data._M_elems._32_8_ =
                                           *(undefined8 *)
                                            (pnVar9[lVar20].m_backend.data._M_elems + 8);
                                      local_208.m_backend.data._M_elems._0_8_ =
                                           *(undefined8 *)&pnVar9[lVar20].m_backend.data;
                                      local_208.m_backend.data._M_elems._8_8_ =
                                           *(undefined8 *)
                                            (pnVar9[lVar20].m_backend.data._M_elems + 2);
                                      puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                                      local_208.m_backend.data._M_elems._16_8_ =
                                           *(undefined8 *)puVar3;
                                      local_208.m_backend.data._M_elems._24_8_ =
                                           *(undefined8 *)(puVar3 + 2);
                                      local_208.m_backend.exp = pnVar9[lVar20].m_backend.exp;
                                      local_208.m_backend.neg = pnVar9[lVar20].m_backend.neg;
                                      local_208.m_backend.fpclass = pnVar9[lVar20].m_backend.fpclass
                                      ;
                                      local_208.m_backend.prec_elem =
                                           pnVar9[lVar20].m_backend.prec_elem;
                                      local_6f0.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (this->
                                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                )._tolerances.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr;
                                      local_6f0.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                                      if (local_6f0.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_6f0.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_6f0.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_6f0.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_6f0.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      FixBoundsPS::FixBoundsPS
                                                (pFVar22,pSVar36,iVar29,&local_208,&local_6f0);
                                      result.m_backend.data._M_elems._0_8_ = pFVar22;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                 (result.m_backend.data._M_elems + 2),pFVar22);
                                      if (local_6f0.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_6f0.
                                                                                                      
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      std::
                                      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ::push_back(&local_878->data,(value_type *)&result.m_backend);
                                      (*(pSVar36->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2d])
                                                (pSVar36,lVar20,
                                                 (pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar20,
                                                 0);
                                      goto joined_r0x002eb07c;
                                    }
                                    goto LAB_002ebbe3;
                                  }
                                }
                              }
                            }
LAB_002eb5dc:
                            pnVar9 = (pSVar36->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            local_428 = *(undefined8 *)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                            local_448 = *(element_type **)&pnVar9[lVar20].m_backend.data;
                            p_Stack_440 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           (pnVar9[lVar20].m_backend.data._M_elems + 2);
                            puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                            local_438 = *(undefined8 *)puVar3;
                            uStack_430 = *(undefined8 *)(puVar3 + 2);
                            pnVar9 = (pSVar36->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        **)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                            local_478 = *(int **)&pnVar9[lVar20].m_backend.data;
                            auStack_470 = *(uint (*) [2])
                                           (pnVar9[lVar20].m_backend.data._M_elems + 2);
                            puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                            local_468 = *(uint (*) [2])puVar3;
                            auStack_460 = *(uint (*) [2])(puVar3 + 2);
                            iVar29 = pnVar9[lVar20].m_backend.exp;
                            bVar4 = pnVar9[lVar20].m_backend.neg;
                            lVar37._0_4_ = pnVar9[lVar20].m_backend.fpclass;
                            lVar37._4_4_ = pnVar9[lVar20].m_backend.prec_elem;
                            local_458 = pnVar28;
                            feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_110,this);
                            ptr_1.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = local_448;
                            ptr_1.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi = p_Stack_440;
                            perm = local_478;
                            auStack_8b0[0] = auStack_470[0];
                            auStack_8b0[1] = auStack_470[1];
                            local_8a8[0] = local_468[0];
                            local_8a8[1] = local_468[1];
                            auStack_8a0[0] = auStack_460[0];
                            auStack_8a0[1] = auStack_460[1];
                            local_898 = local_458;
                            local_890 = iVar29;
                            local_88c = bVar4;
                            local_888 = lVar37;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_2,(soplex *)&ptr_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,pnVar28);
                            result.m_backend.data._M_elems._32_5_ =
                                 result_2.m_backend.data._M_elems._32_5_;
                            result.m_backend.data._M_elems[9]._1_3_ =
                                 result_2.m_backend.data._M_elems[9]._1_3_;
                            result.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                            result.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                            result.m_backend.data._M_elems._24_5_ =
                                 result_2.m_backend.data._M_elems._24_5_;
                            result.m_backend.data._M_elems[7]._1_3_ =
                                 result_2.m_backend.data._M_elems[7]._1_3_;
                            result.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                            result.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                            result.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                            result.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                            auVar12 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
                            result.m_backend.exp = result_2.m_backend.exp;
                            result.m_backend.neg = result_2.m_backend.neg;
                            result.m_backend.fpclass = result_2.m_backend.fpclass;
                            result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                            if ((result_2.m_backend.neg == true) &&
                               (result.m_backend.data._M_elems[0] =
                                     result_2.m_backend.data._M_elems[0],
                               result.m_backend.data._M_elems[0] != 0 ||
                               result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                              result.m_backend.neg = false;
                            }
                            pSVar36 = local_870;
                            result.m_backend.data._M_elems._0_16_ = auVar12;
                            if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                                (local_110.fpclass != cpp_dec_float_NaN)) &&
                               (iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result.m_backend,&local_110),
                               pSVar36 = local_870, iVar29 < 1)) {
                              local_730[lVar20] = true;
                              local_618[lVar20] = true;
                              piVar11 = (this->m_stat).data + 0xd;
                              *piVar11 = *piVar11 + 1;
                            }
                          }
                          else {
                            iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&result.m_backend,&local_d8);
                            pSVar36 = local_870;
                            if (0 < iVar16) goto LAB_002e9908;
                            pnVar9 = (local_870->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        **)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                            local_388 = *(element_type **)&pnVar9[lVar20].m_backend.data;
                            p_Stack_380 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           (pnVar9[lVar20].m_backend.data._M_elems + 2);
                            puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                            local_378 = *(undefined8 *)puVar3;
                            uStack_370 = *(undefined8 *)(puVar3 + 2);
                            local_868 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                         &pnVar9[lVar20].m_backend.fpclass;
                            uStack_860 = 0;
                            local_4c8 = 0xa00000000;
                            local_4f8 = (int *)0x0;
                            auStack_4f0[0] = 0;
                            auStack_4f0[1] = 0;
                            auStack_4f0[2] = 0;
                            auStack_4f0[3] = 0;
                            uStack_4e0 = 0;
                            uStack_4db = 0;
                            local_4d8 = 0;
                            uStack_4d3 = 0;
                            local_4d0 = 0;
                            local_4cc = 0;
                            local_368 = pnVar28;
                            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                      ((cpp_dec_float<50u,int,void> *)&local_4f8,0.0);
                            pTVar8 = (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            p_Var35 = (this->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      )._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                            if (p_Var35 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var35->_M_use_count = p_Var35->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var35->_M_use_count = p_Var35->_M_use_count + 1;
                              }
                            }
                            local_818 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        Tolerances::epsilon(pTVar8);
                            ptr_1.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = local_388;
                            ptr_1.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi = p_Stack_380;
                            auStack_8a0[1]._1_3_ = uStack_4db;
                            auStack_8a0._0_5_ = uStack_4e0;
                            perm = local_4f8;
                            auStack_8b0[0] = auStack_4f0[0];
                            auStack_8b0[1] = auStack_4f0[1];
                            local_8a8[0] = auStack_4f0[2];
                            local_8a8[1] = auStack_4f0[3];
                            local_898 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT35(uStack_4d3,local_4d8);
                            local_890 = local_4d0;
                            local_88c = (bool)local_4cc;
                            local_888 = local_4c8;
                            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                      (&result_2,(soplex *)&ptr_1,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&perm,pnVar28);
                            if ((NAN((double)local_818)) ||
                               (result_2.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002ea171:
                              bVar4 = false;
                            }
                            else {
                              result.m_backend.fpclass = cpp_dec_float_finite;
                              result.m_backend.prec_elem = 10;
                              result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                              result.m_backend.data._M_elems[4] = 0;
                              result.m_backend.data._M_elems[5] = 0;
                              result.m_backend.data._M_elems._24_5_ = 0;
                              result.m_backend.data._M_elems[7]._1_3_ = 0;
                              result.m_backend.data._M_elems._32_5_ = 0;
                              result.m_backend.data._M_elems[9]._1_3_ = 0;
                              result.m_backend.exp = 0;
                              result.m_backend.neg = false;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                        (double)local_818);
                              iVar16 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_2.m_backend,&result.m_backend);
                              if (0 < iVar16) goto LAB_002ea171;
                              pnVar9 = (pSVar36->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          **)(pnVar9[lVar20].m_backend.data._M_elems + 8);
                              local_3b8 = *(element_type **)&pnVar9[lVar20].m_backend.data;
                              p_Stack_3b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                             (pnVar9[lVar20].m_backend.data._M_elems + 2);
                              puVar3 = pnVar9[lVar20].m_backend.data._M_elems + 4;
                              local_3a8 = *(undefined8 *)puVar3;
                              uStack_3a0 = *(undefined8 *)(puVar3 + 2);
                              local_818 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                           &pnVar9[lVar20].m_backend.fpclass;
                              uStack_810 = 0;
                              local_508 = 0xa00000000;
                              local_538 = (int *)0x0;
                              auStack_530[0] = 0;
                              auStack_530[1] = 0;
                              auStack_530[2] = 0;
                              auStack_530[3] = 0;
                              uStack_520 = 0;
                              uStack_51b = 0;
                              local_518 = 0;
                              uStack_513 = 0;
                              local_510 = 0;
                              local_50c = 0;
                              local_398 = pnVar28;
                              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                              operator=((cpp_dec_float<50u,int,void> *)&local_538,0.0);
                              pTVar8 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_868 = (this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_868 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_868->_M_use_count = local_868->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_868->_M_use_count = local_868->_M_use_count + 1;
                                }
                              }
                              local_828 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          Tolerances::epsilon(pTVar8);
                              ptr_1.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = local_3b8;
                              ptr_1.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi = p_Stack_3b0;
                              auStack_8a0[1]._1_3_ = uStack_51b;
                              auStack_8a0._0_5_ = uStack_520;
                              perm = local_538;
                              auStack_8b0[0] = auStack_530[0];
                              auStack_8b0[1] = auStack_530[1];
                              local_8a8[0] = auStack_530[2];
                              local_8a8[1] = auStack_530[3];
                              local_898 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT35(uStack_513,local_518);
                              local_890 = local_510;
                              local_88c = (bool)local_50c;
                              local_888 = local_508;
                              uStack_820 = extraout_XMM0_Qb;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_2,(soplex *)&ptr_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,pnVar28);
                              if ((NAN((double)local_828)) ||
                                 (result_2.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002eadc1:
                                bVar4 = false;
                                this_00 = local_868;
                              }
                              else {
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                          -(double)local_828);
                                iVar16 = boost::multiprecision::backends::
                                         cpp_dec_float<50U,_int,_void>::compare
                                                   (&result_2.m_backend,&result.m_backend);
                                if (iVar16 < 1) goto LAB_002eadc1;
                                pnVar9 = (pSVar36->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).low.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            **)(pnVar9[lVar37].m_backend.data._M_elems + 8);
                                local_3e8 = *(element_type **)&pnVar9[lVar37].m_backend.data;
                                p_Stack_3e0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                               (pnVar9[lVar37].m_backend.data._M_elems + 2);
                                puVar3 = pnVar9[lVar37].m_backend.data._M_elems + 4;
                                local_3d8 = *(undefined8 *)puVar3;
                                uStack_3d0 = *(undefined8 *)(puVar3 + 2);
                                local_828 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                             &pnVar9[lVar37].m_backend.fpclass;
                                uStack_820 = 0;
                                local_548 = 0xa00000000;
                                local_578 = (int *)0x0;
                                auStack_570[0] = 0;
                                auStack_570[1] = 0;
                                auStack_570[2] = 0;
                                auStack_570[3] = 0;
                                uStack_560 = 0;
                                uStack_55b = 0;
                                local_558 = 0;
                                uStack_553 = 0;
                                local_550 = 0;
                                local_54c = 0;
                                local_3c8 = pnVar28;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&local_578,0.0);
                                pTVar8 = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_818 = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                                if (local_818 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                   ) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    local_818->_M_use_count = local_818->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    local_818->_M_use_count = local_818->_M_use_count + 1;
                                  }
                                }
                                local_698 = Tolerances::epsilon(pTVar8);
                                ptr_1.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = local_3e8;
                                ptr_1.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi = p_Stack_3e0;
                                auStack_8a0[1]._1_3_ = uStack_55b;
                                auStack_8a0._0_5_ = uStack_560;
                                perm = local_578;
                                auStack_8b0[0] = auStack_570[0];
                                auStack_8b0[1] = auStack_570[1];
                                local_8a8[0] = auStack_570[2];
                                local_8a8[1] = auStack_570[3];
                                local_898 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)CONCAT35(uStack_553,local_558);
                                local_890 = local_550;
                                local_88c = (bool)local_54c;
                                local_888 = local_548;
                                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                          (&result_2,(soplex *)&ptr_1,
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&perm,pnVar28);
                                if ((NAN(local_698)) ||
                                   (result_2.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002eafb2:
                                  bVar4 = false;
                                }
                                else {
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                            local_698);
                                  iVar16 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&result_2.m_backend,&result.m_backend);
                                  if (0 < iVar16) goto LAB_002eafb2;
                                  pnVar9 = (pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  pnVar28 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              **)(pnVar9[lVar37].m_backend.data._M_elems + 8);
                                  local_418 = *(element_type **)&pnVar9[lVar37].m_backend.data;
                                  p_Stack_410 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                 (pnVar9[lVar37].m_backend.data._M_elems + 2);
                                  puVar3 = pnVar9[lVar37].m_backend.data._M_elems + 4;
                                  local_408 = *(undefined8 *)puVar3;
                                  uStack_400 = *(undefined8 *)(puVar3 + 2);
                                  local_698 = *(double *)&pnVar9[lVar37].m_backend.fpclass;
                                  uStack_690 = 0;
                                  local_588 = 0xa00000000;
                                  local_5b8 = (int *)0x0;
                                  auStack_5b0[0] = 0;
                                  auStack_5b0[1] = 0;
                                  auStack_5b0[2] = 0;
                                  auStack_5b0[3] = 0;
                                  uStack_5a0 = 0;
                                  uStack_59b = 0;
                                  local_598 = 0;
                                  uStack_593 = 0;
                                  local_590 = 0;
                                  local_58c = 0;
                                  local_3f8 = pnVar28;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&local_5b8,0.0);
                                  pTVar8 = (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  local_828 = (this->
                                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              )._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi;
                                  if (local_828 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      local_828->_M_use_count = local_828->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      local_828->_M_use_count = local_828->_M_use_count + 1;
                                    }
                                  }
                                  local_298 = Tolerances::epsilon(pTVar8);
                                  ptr_1.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = local_418;
                                  ptr_1.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi = p_Stack_410;
                                  auStack_8a0[1]._1_3_ = uStack_59b;
                                  auStack_8a0._0_5_ = uStack_5a0;
                                  perm = local_5b8;
                                  auStack_8b0[0] = auStack_5b0[0];
                                  auStack_8b0[1] = auStack_5b0[1];
                                  local_8a8[0] = auStack_5b0[2];
                                  local_8a8[1] = auStack_5b0[3];
                                  local_898 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)CONCAT35(uStack_593,local_598);
                                  local_890 = local_590;
                                  local_88c = (bool)local_58c;
                                  local_888 = local_588;
                                  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                            (&result_2,(soplex *)&ptr_1,
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&perm,pnVar28);
                                  bVar4 = false;
                                  if ((!NAN(local_298)) &&
                                     (result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                              -local_298);
                                    iVar16 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (&result_2.m_backend,&result.m_backend);
                                    bVar4 = 0 < iVar16;
                                  }
                                  if (local_828 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_828);
                                  }
                                }
                                this_00 = local_868;
                                if (local_818 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                   ) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_818);
                                }
                              }
                              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (this_00);
                              }
                            }
                            if (p_Var35 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var35)
                              ;
                            }
                            if (bVar4) {
                              pDVar21 = (DuplicateColsPS *)operator_new(0x168);
                              local_188.m_backend.data._M_elems[9]._1_3_ =
                                   factor.m_backend.data._M_elems[9]._1_3_;
                              local_188.m_backend.data._M_elems._32_5_ =
                                   factor.m_backend.data._M_elems._32_5_;
                              local_188.m_backend.data._M_elems[7]._1_3_ =
                                   factor.m_backend.data._M_elems[7]._1_3_;
                              local_188.m_backend.data._M_elems._24_5_ =
                                   factor.m_backend.data._M_elems._24_5_;
                              local_188.m_backend.data._M_elems[4] =
                                   factor.m_backend.data._M_elems[4];
                              local_188.m_backend.data._M_elems[5] =
                                   factor.m_backend.data._M_elems[5];
                              local_188.m_backend.data._M_elems[0] =
                                   factor.m_backend.data._M_elems[0];
                              local_188.m_backend.data._M_elems[1] =
                                   factor.m_backend.data._M_elems[1];
                              local_188.m_backend.data._M_elems[2] =
                                   factor.m_backend.data._M_elems[2];
                              local_188.m_backend.data._M_elems[3] =
                                   factor.m_backend.data._M_elems[3];
                              local_188.m_backend.exp = factor.m_backend.exp;
                              local_188.m_backend.neg = factor.m_backend.neg;
                              local_188.m_backend.fpclass = factor.m_backend.fpclass;
                              local_188.m_backend.prec_elem = factor.m_backend.prec_elem;
                              DataArray<int>::DataArray(&local_650,&local_5d0);
                              local_6d0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_6d0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_6d0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_6d0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_6d0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_6d0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_6d0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar21,pSVar36,iVar29,iVar18,&local_188,&local_650,
                                         &local_6d0,false,false);
                              ptr_1.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)pDVar21;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                                        (&ptr_1.
                                          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,pDVar21);
                              if (local_6d0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_6d0.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_650.data != (int *)0x0) {
                                free(local_650.data);
                                local_650.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&local_878->data,&ptr_1);
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) goto LAB_002eab5d;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar29 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if (iVar29 < 1) {
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar29 = boost::multiprecision::backends::
                                           cpp_dec_float<50U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if (iVar29 < 0) {
                                    pcVar34 = &(pSVar36->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                              local_848);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar29 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), 0 < iVar29))
                                    {
                                      pcVar34 = &(pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result_2,local_858);
                                      if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                          (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar29 = boost::multiprecision::backends::
                                                   cpp_dec_float<50U,_int,_void>::compare
                                                             (pcVar34,&result_2.m_backend),
                                         -1 < iVar29)) goto LAB_002ea774;
                                      pcVar38 = &(pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                                 m_backend;
                                      pcVar23 = &(pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      pcVar34 = &factor.m_backend;
                                      if (&result_2.m_backend != pcVar23) {
                                        result_2.m_backend.data._M_elems._32_5_ =
                                             factor.m_backend.data._M_elems._32_5_;
                                        result_2.m_backend.data._M_elems[9]._1_3_ =
                                             factor.m_backend.data._M_elems[9]._1_3_;
                                        result_2.m_backend.data._M_elems[4] =
                                             factor.m_backend.data._M_elems[4];
                                        result_2.m_backend.data._M_elems[5] =
                                             factor.m_backend.data._M_elems[5];
                                        result_2.m_backend.data._M_elems._24_5_ =
                                             factor.m_backend.data._M_elems._24_5_;
                                        result_2.m_backend.data._M_elems[7]._1_3_ =
                                             factor.m_backend.data._M_elems[7]._1_3_;
                                        result_2.m_backend.data._M_elems[2] =
                                             factor.m_backend.data._M_elems[2];
                                        result_2.m_backend.data._M_elems[3] =
                                             factor.m_backend.data._M_elems[3];
                                        result_2.m_backend.data._M_elems[0] =
                                             factor.m_backend.data._M_elems[0];
                                        result_2.m_backend.data._M_elems[1] =
                                             factor.m_backend.data._M_elems[1];
                                        result_2.m_backend.exp = factor.m_backend.exp;
                                        result_2.m_backend.neg = factor.m_backend.neg;
                                        result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                        result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                        pcVar34 = pcVar23;
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator*=(&result_2.m_backend,pcVar34);
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 10;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[4] = 0;
                                      result.m_backend.data._M_elems[5] = 0;
                                      result.m_backend.data._M_elems._24_5_ = 0;
                                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result.m_backend.data._M_elems._32_5_ = 0;
                                      result.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      if (&result.m_backend != pcVar38) {
                                        uVar7 = *(undefined8 *)((pcVar38->data)._M_elems + 8);
                                        result.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                                        result.m_backend.data._M_elems[9]._1_3_ =
                                             (undefined3)((ulong)uVar7 >> 0x28);
                                        result.m_backend.data._M_elems._0_16_ =
                                             *(undefined1 (*) [16])(pcVar38->data)._M_elems;
                                        result.m_backend.data._M_elems._16_8_ =
                                             *(undefined8 *)((pcVar38->data)._M_elems + 4);
                                        uVar7 = *(undefined8 *)((pcVar38->data)._M_elems + 6);
                                        result.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                                        result.m_backend.data._M_elems[7]._1_3_ =
                                             (undefined3)((ulong)uVar7 >> 0x28);
                                        result.m_backend.exp = pcVar38->exp;
                                        result.m_backend.neg = pcVar38->neg;
                                        result.m_backend.fpclass = pcVar38->fpclass;
                                        result.m_backend.prec_elem = pcVar38->prec_elem;
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator+=(&result.m_backend,&result_2.m_backend);
                                      (*(pSVar36->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(pSVar36,lVar37,&result.m_backend,0)
                                      ;
                                    }
                                    else {
LAB_002ea774:
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 10;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[4] = 0;
                                      result.m_backend.data._M_elems[5] = 0;
                                      result.m_backend.data._M_elems._24_5_ = 0;
                                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result.m_backend.data._M_elems._32_5_ = 0;
                                      result.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                                local_848);
                                      (*(pSVar36->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(pSVar36,lVar37,&result.m_backend,0)
                                      ;
                                    }
                                    pcVar34 = &(pSVar36->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).up.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                              local_858);
                                    if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar29 = boost::multiprecision::backends::
                                                 cpp_dec_float<50U,_int,_void>::compare
                                                           (pcVar34,&result.m_backend), iVar29 < 0))
                                    {
                                      pcVar34 = &(pSVar36->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 10;
                                      result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems._24_5_ = 0;
                                      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                      result_2.m_backend.data._M_elems._32_5_ = 0;
                                      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                      operator=((cpp_dec_float<50u,int,void> *)&result_2,local_848);
                                      if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                          (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                         (iVar29 = boost::multiprecision::backends::
                                                   cpp_dec_float<50U,_int,_void>::compare
                                                             (pcVar34,&result_2.m_backend),
                                         0 < iVar29)) {
                                        pcVar23 = &(pSVar36->
                                                                                                      
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).up.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                                  m_backend;
                                        pcVar38 = &(pSVar36->
                                                                                                      
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                  m_backend;
                                        result_2.m_backend.fpclass = cpp_dec_float_finite;
                                        result_2.m_backend.prec_elem = 10;
                                        result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result_2.m_backend.data._M_elems[4] = 0;
                                        result_2.m_backend.data._M_elems[5] = 0;
                                        result_2.m_backend.data._M_elems._24_5_ = 0;
                                        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                        result_2.m_backend.data._M_elems._32_5_ = 0;
                                        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                        result_2.m_backend.exp = 0;
                                        result_2.m_backend.neg = false;
                                        pcVar34 = &factor.m_backend;
                                        if (&result_2.m_backend != pcVar38) {
                                          result_2.m_backend.data._M_elems._32_5_ =
                                               factor.m_backend.data._M_elems._32_5_;
                                          result_2.m_backend.data._M_elems[9]._1_3_ =
                                               factor.m_backend.data._M_elems[9]._1_3_;
                                          result_2.m_backend.data._M_elems[4] =
                                               factor.m_backend.data._M_elems[4];
                                          result_2.m_backend.data._M_elems[5] =
                                               factor.m_backend.data._M_elems[5];
                                          result_2.m_backend.data._M_elems._24_5_ =
                                               factor.m_backend.data._M_elems._24_5_;
                                          result_2.m_backend.data._M_elems[7]._1_3_ =
                                               factor.m_backend.data._M_elems[7]._1_3_;
                                          result_2.m_backend.data._M_elems[2] =
                                               factor.m_backend.data._M_elems[2];
                                          result_2.m_backend.data._M_elems[3] =
                                               factor.m_backend.data._M_elems[3];
                                          result_2.m_backend.data._M_elems[0] =
                                               factor.m_backend.data._M_elems[0];
                                          result_2.m_backend.data._M_elems[1] =
                                               factor.m_backend.data._M_elems[1];
                                          result_2.m_backend.exp = factor.m_backend.exp;
                                          result_2.m_backend.neg = factor.m_backend.neg;
                                          result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                          result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                          pcVar34 = pcVar38;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<50U,_int,_void>::operator*=
                                                  (&result_2.m_backend,pcVar34);
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 10;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[4] = 0;
                                        result.m_backend.data._M_elems[5] = 0;
                                        result.m_backend.data._M_elems._24_5_ = 0;
                                        result.m_backend.data._M_elems[7]._1_3_ = 0;
                                        result.m_backend.data._M_elems._32_5_ = 0;
                                        result.m_backend.data._M_elems[9]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        if (&result.m_backend != pcVar23) {
                                          uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                                          result.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                                          result.m_backend.data._M_elems[9]._1_3_ =
                                               (undefined3)((ulong)uVar7 >> 0x28);
                                          result.m_backend.data._M_elems._0_16_ =
                                               *(undefined1 (*) [16])(pcVar23->data)._M_elems;
                                          result.m_backend.data._M_elems._16_8_ =
                                               *(undefined8 *)((pcVar23->data)._M_elems + 4);
                                          uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                                          result.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                                          result.m_backend.data._M_elems[7]._1_3_ =
                                               (undefined3)((ulong)uVar7 >> 0x28);
                                          result.m_backend.exp = pcVar23->exp;
                                          result.m_backend.neg = pcVar23->neg;
                                          result.m_backend.fpclass = pcVar23->fpclass;
                                          result.m_backend.prec_elem = pcVar23->prec_elem;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<50U,_int,_void>::operator+=
                                                  (&result.m_backend,&result_2.m_backend);
                                        (*(pSVar36->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .
                                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._vptr_ClassArray[0x2d])
                                                  (pSVar36,lVar37,&result.m_backend,0);
                                        goto LAB_002eab5d;
                                      }
                                    }
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                    operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                              local_858);
                                    (*(pSVar36->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])(pSVar36,lVar37,&result.m_backend,0);
                                  }
                                }
                              }
                              else {
                                pcVar34 = &(pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).low.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_848
                                         );
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar29 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), 0 < iVar29)) {
                                  pcVar34 = &(pSVar36->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result_2,local_848);
                                  if (((pcVar34->fpclass != cpp_dec_float_NaN) &&
                                      (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar29 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (pcVar34,&result_2.m_backend), iVar29 < 1))
                                  goto LAB_002ea872;
                                  pnVar9 = (pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).low.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar23 = &pnVar9[lVar20].m_backend;
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  pcVar34 = &factor.m_backend;
                                  if (&result_2.m_backend != pcVar23) {
                                    result_2.m_backend.data._M_elems._32_5_ =
                                         factor.m_backend.data._M_elems._32_5_;
                                    result_2.m_backend.data._M_elems[9]._1_3_ =
                                         factor.m_backend.data._M_elems[9]._1_3_;
                                    result_2.m_backend.data._M_elems[4] =
                                         factor.m_backend.data._M_elems[4];
                                    result_2.m_backend.data._M_elems[5] =
                                         factor.m_backend.data._M_elems[5];
                                    result_2.m_backend.data._M_elems._24_5_ =
                                         factor.m_backend.data._M_elems._24_5_;
                                    result_2.m_backend.data._M_elems[7]._1_3_ =
                                         factor.m_backend.data._M_elems[7]._1_3_;
                                    result_2.m_backend.data._M_elems[2] =
                                         factor.m_backend.data._M_elems[2];
                                    result_2.m_backend.data._M_elems[3] =
                                         factor.m_backend.data._M_elems[3];
                                    result_2.m_backend.data._M_elems[0] =
                                         factor.m_backend.data._M_elems[0];
                                    result_2.m_backend.data._M_elems[1] =
                                         factor.m_backend.data._M_elems[1];
                                    result_2.m_backend.exp = factor.m_backend.exp;
                                    result_2.m_backend.neg = factor.m_backend.neg;
                                    result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar34 = pcVar23;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator*=(&result_2.m_backend,pcVar34);
                                  pcVar34 = &pnVar9[lVar37].m_backend;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result.m_backend != pcVar34) {
                                    uVar7 = *(undefined8 *)((pcVar34->data)._M_elems + 8);
                                    result.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                                    result.m_backend.data._M_elems[9]._1_3_ =
                                         (undefined3)((ulong)uVar7 >> 0x28);
                                    result.m_backend.data._M_elems._0_16_ =
                                         *(undefined1 (*) [16])(pcVar34->data)._M_elems;
                                    result.m_backend.data._M_elems._16_8_ =
                                         *(undefined8 *)((pcVar34->data)._M_elems + 4);
                                    uVar7 = *(undefined8 *)((pcVar34->data)._M_elems + 6);
                                    result.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                                    result.m_backend.data._M_elems[7]._1_3_ =
                                         (undefined3)((ulong)uVar7 >> 0x28);
                                    result.m_backend.exp = pcVar34->exp;
                                    result.m_backend.neg = pcVar34->neg;
                                    result.m_backend.fpclass = pcVar34->fpclass;
                                    result.m_backend.prec_elem = pcVar34->prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  operator+=(&result.m_backend,&result_2.m_backend);
                                  (*(pSVar36->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(pSVar36,lVar37,&result.m_backend,0);
                                }
                                else {
LAB_002ea872:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 10;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[4] = 0;
                                  result.m_backend.data._M_elems[5] = 0;
                                  result.m_backend.data._M_elems._24_5_ = 0;
                                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result.m_backend.data._M_elems._32_5_ = 0;
                                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,
                                            local_848);
                                  (*(pSVar36->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(pSVar36,lVar37,&result.m_backend,0);
                                }
                                pcVar34 = &(pSVar36->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_858
                                         );
                                if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar29 = boost::multiprecision::backends::
                                             cpp_dec_float<50U,_int,_void>::compare
                                                       (pcVar34,&result.m_backend), iVar29 < 0)) {
                                  pcVar34 = &(pSVar36->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 10;
                                  result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems._24_5_ = 0;
                                  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                  result_2.m_backend.data._M_elems._32_5_ = 0;
                                  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                  operator=((cpp_dec_float<50u,int,void> *)&result_2,local_858);
                                  if (((pcVar34->fpclass == cpp_dec_float_NaN) ||
                                      (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                     (iVar29 = boost::multiprecision::backends::
                                               cpp_dec_float<50U,_int,_void>::compare
                                                         (pcVar34,&result_2.m_backend), iVar29 < 0))
                                  {
                                    pnVar9 = (pSVar36->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    pcVar23 = &pnVar9[lVar20].m_backend;
                                    result_2.m_backend.fpclass = cpp_dec_float_finite;
                                    result_2.m_backend.prec_elem = 10;
                                    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result_2.m_backend.data._M_elems[4] = 0;
                                    result_2.m_backend.data._M_elems[5] = 0;
                                    result_2.m_backend.data._M_elems._24_5_ = 0;
                                    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result_2.m_backend.data._M_elems._32_5_ = 0;
                                    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result_2.m_backend.exp = 0;
                                    result_2.m_backend.neg = false;
                                    pcVar34 = &factor.m_backend;
                                    if (&result_2.m_backend != pcVar23) {
                                      result_2.m_backend.data._M_elems._32_5_ =
                                           factor.m_backend.data._M_elems._32_5_;
                                      result_2.m_backend.data._M_elems[9]._1_3_ =
                                           factor.m_backend.data._M_elems[9]._1_3_;
                                      result_2.m_backend.data._M_elems[4] =
                                           factor.m_backend.data._M_elems[4];
                                      result_2.m_backend.data._M_elems[5] =
                                           factor.m_backend.data._M_elems[5];
                                      result_2.m_backend.data._M_elems._24_5_ =
                                           factor.m_backend.data._M_elems._24_5_;
                                      result_2.m_backend.data._M_elems[7]._1_3_ =
                                           factor.m_backend.data._M_elems[7]._1_3_;
                                      result_2.m_backend.data._M_elems[2] =
                                           factor.m_backend.data._M_elems[2];
                                      result_2.m_backend.data._M_elems[3] =
                                           factor.m_backend.data._M_elems[3];
                                      result_2.m_backend.data._M_elems[0] =
                                           factor.m_backend.data._M_elems[0];
                                      result_2.m_backend.data._M_elems[1] =
                                           factor.m_backend.data._M_elems[1];
                                      result_2.m_backend.exp = factor.m_backend.exp;
                                      result_2.m_backend.neg = factor.m_backend.neg;
                                      result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                      result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                      pcVar34 = pcVar23;
                                    }
                                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                    operator*=(&result_2.m_backend,pcVar34);
                                    pcVar34 = &pnVar9[lVar37].m_backend;
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 10;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[4] = 0;
                                    result.m_backend.data._M_elems[5] = 0;
                                    result.m_backend.data._M_elems._24_5_ = 0;
                                    result.m_backend.data._M_elems[7]._1_3_ = 0;
                                    result.m_backend.data._M_elems._32_5_ = 0;
                                    result.m_backend.data._M_elems[9]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    if (&result.m_backend != pcVar34) {
                                      uVar7 = *(undefined8 *)((pcVar34->data)._M_elems + 8);
                                      result.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                                      result.m_backend.data._M_elems[9]._1_3_ =
                                           (undefined3)((ulong)uVar7 >> 0x28);
                                      result.m_backend.data._M_elems._0_16_ =
                                           *(undefined1 (*) [16])(pcVar34->data)._M_elems;
                                      result.m_backend.data._M_elems._16_8_ =
                                           *(undefined8 *)((pcVar34->data)._M_elems + 4);
                                      uVar7 = *(undefined8 *)((pcVar34->data)._M_elems + 6);
                                      result.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                                      result.m_backend.data._M_elems[7]._1_3_ =
                                           (undefined3)((ulong)uVar7 >> 0x28);
                                      result.m_backend.exp = pcVar34->exp;
                                      result.m_backend.neg = pcVar34->neg;
                                      result.m_backend.fpclass = pcVar34->fpclass;
                                      result.m_backend.prec_elem = pcVar34->prec_elem;
                                    }
                                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                    operator+=(&result.m_backend,&result_2.m_backend);
                                    (*(pSVar36->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])(pSVar36,lVar37,&result.m_backend,0);
                                    goto LAB_002eab5d;
                                  }
                                }
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 10;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[4] = 0;
                                result.m_backend.data._M_elems[5] = 0;
                                result.m_backend.data._M_elems._24_5_ = 0;
                                result.m_backend.data._M_elems[7]._1_3_ = 0;
                                result.m_backend.data._M_elems._32_5_ = 0;
                                result.m_backend.data._M_elems[9]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&result.m_backend,local_858
                                         );
                                (*(pSVar36->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2d])(pSVar36,lVar37,&result.m_backend,0);
                              }
LAB_002eab5d:
                              local_730[lVar20] = true;
                              piVar11 = (this->m_stat).data + 0xe;
                              *piVar11 = *piVar11 + 1;
                              if (ptr_1.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (ptr_1.
                                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                            }
                          }
                          pDVar24 = (this->m_dupCols).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                      }
                    }
                    lVar30 = lVar30 + 1;
                    lVar37 = (long)&pDVar24->_vptr_DSVectorBase + local_7f8;
                    lVar33 = lVar33 + 0x3c;
                    lVar20 = local_688;
                  } while (lVar30 < *(int *)(lVar37 + 0x14));
                }
                lVar20 = lVar20 + 1;
                lVar37 = local_7f8;
                lVar30 = local_678;
                uVar26 = local_800;
              } while (lVar20 < *(int *)((long)&(pDVar24->
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).memused + local_7f8));
            }
          }
          lVar30 = lVar30 + 1;
          n = (pSVar36->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
          uVar31 = (ulong)(int)n;
        } while (lVar30 < (long)uVar31);
        local_800 = uVar26;
        if (0 < (int)n) {
          lVar30 = 0;
          do {
            if (local_618[lVar30] == true) {
              fixColumn(this,pSVar36,(int)lVar30,false);
              uVar31 = (ulong)(uint)(pSVar36->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thenum;
            }
            lVar30 = lVar30 + 1;
            n = (uint)uVar31;
          } while (lVar30 < (int)n);
        }
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,n);
      uVar26 = (ulong)n;
      if ((int)n < 1) {
        uVar32 = 0;
        iVar29 = 0;
      }
      else {
        pIVar5 = (pSVar36->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        pDVar10 = (pSVar36->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey;
        uVar31 = 0;
        iVar29 = 0;
        uVar32 = 0;
        do {
          if (local_730[uVar31] == true) {
            perm[uVar31] = -1;
            uVar32 = uVar32 + 1;
            iVar29 = iVar29 + pIVar5[pDVar10[uVar31].idx].data.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused;
          }
          else {
            perm[uVar31] = 0;
          }
          uVar31 = uVar31 + 1;
        } while (uVar26 != uVar31);
      }
      (*(pSVar36->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x17])(pSVar36,perm);
      if (0 < (int)n) {
        piVar11 = (this->m_cIdx).data;
        uVar31 = 0;
        do {
          if (-1 < (long)perm[uVar31]) {
            piVar11[perm[uVar31]] = piVar11[uVar31];
          }
          uVar31 = uVar31 + 1;
        } while (uVar26 != uVar31);
      }
      ptr_1.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar19 = 0;
      if (0 < (int)n) {
        uVar19 = n;
      }
      n_00 = 1;
      if (0 < (int)n) {
        n_00 = uVar19;
      }
      ptr_1.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)CONCAT44(n_00,uVar19);
      spx_alloc<int*>((int **)&ptr_1.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,n_00);
      if (0 < (int)n) {
        uVar31 = 0;
        do {
          *(int *)((long)&(ptr_1.
                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar31 * 4) = perm[uVar31];
          uVar31 = uVar31 + 1;
        } while (uVar26 != uVar31);
      }
      if ((local_800 & 1) != 0) {
        pDVar21 = (DuplicateColsPS *)operator_new(0x168);
        local_38._0_4_ = cpp_dec_float_finite;
        local_38._4_4_ = 10;
        local_68._0_16_ = (undefined1  [16])0x0;
        local_68._16_13_ = SUB1613((undefined1  [16])0x0,0);
        uStack_4b = 0;
        auStack_48 = SUB1613((undefined1  [16])0x0,3);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_68,1.0);
        DataArray<int>::DataArray(&local_668,(DataArray<int> *)&ptr_1);
        local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        DuplicateColsPS::DuplicateColsPS
                  (pDVar21,pSVar36,0,0,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_68,&local_668,&local_720,false,true);
        result.m_backend.data._M_elems._0_8_ = pDVar21;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2),pDVar21);
        if (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_720.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_668.data != (int *)0x0) {
          free(local_668.data);
          local_668.data = (int *)0x0;
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&(this->m_hist).data,(value_type *)&result);
        if (result.m_backend.data._M_elems._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     result.m_backend.data._M_elems._8_8_);
        }
      }
      free(perm);
      perm = (int *)0x0;
      if (0 < (int)uVar32) {
        piVar11 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remCols;
        *piVar11 = *piVar11 + uVar32;
        piVar11 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remNzos;
        *piVar11 = *piVar11 + iVar29;
        pSVar25 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar25 != (SPxOut *)0x0) && (3 < (int)pSVar25->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar25->m_verbosity;
          result_2.m_backend.data._M_elems[0] = 4;
          (*pSVar25->_vptr_SPxOut[2])();
          pSVar25 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate columns) removed ");
          std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],uVar32);
          pSVar25 = soplex::operator<<(pSVar25," cols, ");
          std::ostream::operator<<((ostream *)pSVar25->m_streams[pSVar25->m_verbosity],iVar29);
          pSVar25 = soplex::operator<<(pSVar25," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar25->m_streams[pSVar25->m_verbosity]);
          pSVar25 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar25->_vptr_SPxOut[2])(pSVar25,&result);
        }
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&result.m_backend,(long)(int)n,(type *)0x0);
        pnVar28 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction;
        if (&result_2 != pnVar28) {
          uVar7 = *(undefined8 *)
                   ((this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend.data._M_elems + 8);
          result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
          result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          result_2.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])(pnVar28->m_backend).data._M_elems;
          result_2.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)
                ((this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.data._M_elems + 4);
          uVar7 = *(undefined8 *)
                   ((this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend.data._M_elems + 6);
          result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
          result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          result_2.m_backend.exp =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.exp;
          result_2.m_backend.neg =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.neg;
          result_2.m_backend.fpclass =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.fpclass;
          result_2.m_backend.prec_elem =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_2.m_backend,&result.m_backend);
        if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&result.m_backend,(ulong)uVar32,(type *)0x0);
          iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result_2.m_backend,&result.m_backend);
          if (iVar29 < 0) {
            *local_670 = true;
          }
        }
      }
      if (ptr_1.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        free(ptr_1.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
      }
      RVar15 = OKAY;
LAB_002ebe5b:
      if (local_5d0.data != (int *)0x0) {
        free(local_5d0.data);
      }
      if (local_618 != (bool *)0x0) {
        free(local_618);
      }
      if (local_730 != (bool *)0x0) {
        free(local_730);
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6a8 != (int *)0x0) {
        free(local_6a8);
      }
      if (local_7c8 != (int *)0x0) {
        free(local_7c8);
      }
    }
  }
  return RVar15;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}